

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_module.cpp
# Opt level: O1

ModBody * __thiscall
pfederc::Parser::parseModBody(ModBody *__return_storage_ptr__,Parser *this,bool isprog)

{
  ExprType EVar1;
  int iVar2;
  size_t sVar3;
  pointer pPVar4;
  long *plVar5;
  Token *pTVar6;
  pointer pcVar7;
  size_t sVar8;
  size_t sVar9;
  pointer pPVar10;
  pointer pPVar11;
  istream *piVar12;
  pointer pTVar13;
  ModBody *pMVar14;
  TokenType *pTVar15;
  bool bVar16;
  undefined1 uVar17;
  undefined7 extraout_var;
  pointer pEVar18;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar19;
  pointer pEVar20;
  pointer pTVar21;
  Parser *pPVar22;
  pointer pEVar23;
  long lVar24;
  vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
  *this_00;
  pointer pTVar25;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  Exprs defs;
  Exprs imports;
  Error<pfederc::SyntaxErrorCode> *local_d0;
  undefined1 local_c8 [40];
  ModBody *local_a0;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  local_98;
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  local_78;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_78.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._8_8_ = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._16_8_ = &PTR__BiOpExpr_0012b998;
  local_c8._32_8_ = &PTR__TokenExpr_0012b768;
  local_c8._24_8_ = (Token *)0x0;
  local_a0 = __return_storage_ptr__;
LAB_00119077:
  bVar16 = Token::operator!=(this->lexer->currentToken,TOK_EOL);
  if (bVar16) {
    while (bVar16 = Token::operator==(this->lexer->currentToken,TOK_EOL), bVar16) {
      Lexer::next(this->lexer);
    }
    bVar16 = Token::operator==(this->lexer->currentToken,TOK_EOF);
    pTVar13 = _TERMINATE_MOD_TOKEN.
              super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (!bVar16) {
      if (isprog) {
        parseExpression((Parser *)local_c8,(Precedence)this);
LAB_001190e4:
        bVar16 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
        if (bVar16 || !isprog) {
LAB_00119242:
          bVar16 = Token::operator!=(this->lexer->currentToken,TOK_EOL);
          if (!bVar16) goto LAB_001192ad;
          if (isprog) {
            pTVar6 = this->lexer->currentToken;
            local_d0 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
            sVar8 = (pTVar6->pos).line;
            sVar9 = (pTVar6->pos).startIndex;
            sVar3 = (pTVar6->pos).endIndex;
            local_d0->logLevel = LVL_ERROR;
            local_d0->err = STX_ERR_EXPECTED_EOF_EOL;
            (local_d0->pos).line = sVar8;
            (local_d0->pos).startIndex = sVar9;
            (local_d0->pos).endIndex = sVar3;
            (local_d0->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (local_d0->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (local_d0->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pPVar22 = (Parser *)&stack0xffffffffffffffc8;
          }
          else {
            pTVar6 = this->lexer->currentToken;
            local_d0 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
            sVar8 = (pTVar6->pos).line;
            sVar9 = (pTVar6->pos).startIndex;
            sVar3 = (pTVar6->pos).endIndex;
            local_d0->logLevel = LVL_ERROR;
            local_d0->err = STX_ERR_EXPECTED_EOL;
            (local_d0->pos).line = sVar8;
            (local_d0->pos).startIndex = sVar9;
            (local_d0->pos).endIndex = sVar3;
            (local_d0->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (local_d0->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (local_d0->extraPos).
            super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pPVar22 = (Parser *)(local_48 + 8);
          }
          generateError(pPVar22,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                                 *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     pPVar22);
          if (local_d0 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
            std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                      ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_d0,
                       local_d0);
          }
          skipToStmtEol(this);
          local_c8._8_8_ = CONCAT71(extraout_var,1);
        }
        else {
LAB_001192ad:
          bVar16 = Token::operator==(this->lexer->currentToken,TOK_EOL);
          if (bVar16) {
            Lexer::next(this->lexer);
          }
        }
        uVar19 = local_c8._0_8_;
        if ((Expr *)local_c8._0_8_ != (Expr *)0x0) {
          if (isprog) {
            lVar24 = (long)_ALLOWED_EXPR_PROG.
                           super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)_ALLOWED_EXPR_PROG.
                           super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4;
            pEVar18 = _ALLOWED_EXPR_PROG.
                      super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pEVar23 = _ALLOWED_EXPR_PROG.
                      super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (0 < lVar24) {
              EVar1 = *(ExprType *)&(((string *)(local_c8._0_8_ + 0x18))->_M_dataplus)._M_p;
              pEVar23 = (pointer)(((long)_ALLOWED_EXPR_PROG.
                                         super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)_ALLOWED_EXPR_PROG.
                                         super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>
                                         ._M_impl.super__Vector_impl_data._M_start &
                                  0xfffffffffffffff0U) +
                                 (long)_ALLOWED_EXPR_PROG.
                                       super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
              lVar24 = lVar24 + 1;
              pEVar20 = _ALLOWED_EXPR_PROG.
                        super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                        _M_impl.super__Vector_impl_data._M_start + 2;
              do {
                if (EVar1 == pEVar20[-2]) goto LAB_00119482;
                if (EVar1 == pEVar20[-1]) goto LAB_00119488;
                if (EVar1 == *pEVar20) goto LAB_00119492;
                if (EVar1 == pEVar20[1]) goto LAB_0011948e;
                lVar24 = lVar24 + -1;
                pEVar20 = pEVar20 + 4;
              } while (1 < lVar24);
            }
          }
          else {
            lVar24 = (long)_ALLOWED_EXPR_MOD.
                           super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)_ALLOWED_EXPR_MOD.
                           super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4;
            pEVar18 = _ALLOWED_EXPR_MOD.
                      super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            pEVar23 = _ALLOWED_EXPR_MOD.
                      super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (0 < lVar24) {
              EVar1 = *(ExprType *)&(((string *)(local_c8._0_8_ + 0x18))->_M_dataplus)._M_p;
              pEVar23 = (pointer)(((long)_ALLOWED_EXPR_MOD.
                                         super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)_ALLOWED_EXPR_MOD.
                                         super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>
                                         ._M_impl.super__Vector_impl_data._M_start &
                                  0xfffffffffffffff0U) +
                                 (long)_ALLOWED_EXPR_MOD.
                                       super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
              lVar24 = lVar24 + 1;
              pEVar20 = _ALLOWED_EXPR_MOD.
                        super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                        _M_impl.super__Vector_impl_data._M_start + 2;
              do {
                pEVar18 = _ALLOWED_EXPR_MOD.
                          super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                if (EVar1 == pEVar20[-2]) goto LAB_00119482;
                if (EVar1 == pEVar20[-1]) goto LAB_00119488;
                if (EVar1 == *pEVar20) goto LAB_00119492;
                if (EVar1 == pEVar20[1]) goto LAB_0011948e;
                lVar24 = lVar24 + -1;
                pEVar20 = pEVar20 + 4;
                pEVar18 = _ALLOWED_EXPR_MOD.
                          super__Vector_base<pfederc::ExprType,_std::allocator<pfederc::ExprType>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              } while (1 < lVar24);
            }
          }
          lVar24 = (long)pEVar18 - (long)pEVar23 >> 2;
          if (lVar24 == 1) {
LAB_00119472:
            pEVar20 = pEVar23;
            if (*(ExprType *)&(((string *)(local_c8._0_8_ + 0x18))->_M_dataplus)._M_p != *pEVar23) {
              pEVar20 = pEVar18;
            }
          }
          else if (lVar24 == 2) {
LAB_00119465:
            pEVar20 = pEVar23;
            if (*(ExprType *)&(((string *)(local_c8._0_8_ + 0x18))->_M_dataplus)._M_p != *pEVar23) {
              pEVar23 = pEVar23 + 1;
              goto LAB_00119472;
            }
          }
          else {
            pEVar20 = pEVar18;
            if ((lVar24 == 3) &&
               (pEVar20 = pEVar23,
               *(ExprType *)&(((string *)(local_c8._0_8_ + 0x18))->_M_dataplus)._M_p != *pEVar23)) {
              pEVar23 = pEVar23 + 1;
              goto LAB_00119465;
            }
          }
          goto LAB_00119492;
        }
        goto LAB_00119616;
      }
      pTVar6 = this->lexer->currentToken;
      lVar24 = (long)_TERMINATE_MOD_TOKEN.
                     super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)_TERMINATE_MOD_TOKEN.
                     super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      pTVar25 = _TERMINATE_MOD_TOKEN.
                super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < lVar24) {
        lVar24 = lVar24 + 1;
        pTVar15 = _TERMINATE_MOD_TOKEN.
                  super__Vector_base<pfederc::TokenType,_std::allocator<pfederc::TokenType>_>.
                  _M_impl.super__Vector_impl_data._M_start + 2;
        do {
          pTVar21 = pTVar15;
          bVar16 = Token::operator==(pTVar6,pTVar21[-2]);
          if (bVar16) {
            pTVar21 = pTVar21 + -2;
            goto LAB_00119214;
          }
          bVar16 = Token::operator==(pTVar6,pTVar21[-1]);
          if (bVar16) {
            pTVar21 = pTVar21 + -1;
            goto LAB_00119214;
          }
          bVar16 = Token::operator==(pTVar6,*pTVar21);
          if (bVar16) goto LAB_00119214;
          bVar16 = Token::operator==(pTVar6,pTVar21[1]);
          if (bVar16) {
            pTVar21 = pTVar21 + 1;
            goto LAB_00119214;
          }
          lVar24 = lVar24 + -1;
          pTVar15 = pTVar21 + 4;
        } while (1 < lVar24);
        pTVar25 = pTVar21 + 2;
      }
      lVar24 = (long)pTVar13 - (long)pTVar25 >> 1;
      if (lVar24 == 1) {
LAB_001191e8:
        bVar16 = Token::operator==(pTVar6,*pTVar25);
        pTVar21 = pTVar25;
        if (!bVar16) {
          pTVar21 = pTVar13;
        }
      }
      else if (lVar24 == 2) {
LAB_001191d4:
        bVar16 = Token::operator==(pTVar6,*pTVar25);
        pTVar21 = pTVar25;
        if (!bVar16) {
          pTVar25 = pTVar25 + 1;
          goto LAB_001191e8;
        }
      }
      else {
        pTVar21 = pTVar13;
        if ((lVar24 == 3) &&
           (bVar16 = Token::operator==(pTVar6,*pTVar25), pTVar21 = pTVar25, !bVar16)) {
          pTVar25 = pTVar25 + 1;
          goto LAB_001191d4;
        }
      }
LAB_00119214:
      bVar16 = true;
      if (pTVar21 == pTVar13) {
        parseExpression((Parser *)local_c8,(Precedence)this);
        if (isprog) goto LAB_001190e4;
        goto LAB_00119242;
      }
      goto LAB_00119628;
    }
  }
  goto LAB_0011964d;
LAB_00119482:
  pEVar20 = pEVar20 + -2;
  goto LAB_00119492;
LAB_00119488:
  pEVar20 = pEVar20 + -1;
  goto LAB_00119492;
LAB_0011948e:
  pEVar20 = pEVar20 + 1;
LAB_00119492:
  if (pEVar20 == pEVar18) {
    if (*(int *)&(((string *)(local_c8._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12) {
      if (*(pointer *)local_c8._0_8_ != (pointer)local_c8._16_8_) {
        __cxa_bad_cast();
      }
      bVar16 = (short)((Position *)(local_c8._0_8_ + 0x40))->line == 0x32;
      if (bVar16) {
LAB_0011953a:
        if (bVar16) goto LAB_00119497;
      }
      else {
        if (*(pointer *)local_c8._0_8_ != (pointer)local_c8._16_8_) {
          __cxa_bad_cast();
        }
        if ((short)((Position *)(local_c8._0_8_ + 0x40))->line == 0x3d) {
          if (*(pointer *)local_c8._0_8_ != (pointer)local_c8._16_8_) goto LAB_0011977a;
          plVar5 = (long *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_c8._0_8_ + 0x48))->_M_allocated_capacity;
          if ((int)plVar5[3] == 0x12) {
            if ((pointer)*plVar5 != (pointer)local_c8._16_8_) {
              __cxa_bad_cast();
            }
            bVar16 = (short)plVar5[8] == 0x53;
            goto LAB_0011953a;
          }
        }
      }
    }
    local_d0 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
    pPVar10 = (((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)(uVar19 + 0x20))->
              super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pPVar11 = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(uVar19 + 0x28))->_M_allocated_capacity;
    pPVar4 = *(pointer *)(uVar19 + 0x30);
    local_d0->logLevel = LVL_ERROR;
    local_d0->err = STX_ERR_INVALID_EXPR;
    (local_d0->pos).line = (size_t)pPVar10;
    (local_d0->pos).startIndex = (size_t)pPVar11;
    (local_d0->pos).endIndex = (size_t)pPVar4;
    (local_d0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_d0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_d0->extraPos).super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pPVar22 = (Parser *)local_48;
LAB_001195e7:
    generateError(pPVar22,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                           *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)pPVar22);
    uVar19 = extraout_RAX;
    if (local_d0 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_d0,local_d0);
      uVar19 = extraout_RAX_00;
    }
    local_c8._8_8_ = CONCAT71((int7)((ulong)uVar19 >> 8),1);
  }
  else {
LAB_00119497:
    iVar2 = *(int *)&(((string *)(local_c8._0_8_ + 0x18))->_M_dataplus)._M_p;
    this_00 = (vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
               *)&local_78;
    if (iVar2 != 2) {
      if (iVar2 == 1) {
        if ((Token *)local_c8._24_8_ == (Token *)0x0) {
          if (*(undefined ***)local_c8._0_8_ != (undefined **)local_c8._32_8_) {
LAB_0011977a:
            __cxa_bad_cast();
          }
          local_c8._24_8_ = *(undefined8 *)(local_c8._0_8_ + 0x38);
          goto LAB_00119616;
        }
        local_d0 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
        pPVar10 = (((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)(uVar19 + 0x20)
                   )->super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pPVar11 = (pointer)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(uVar19 + 0x28))->_M_allocated_capacity;
        pPVar4 = *(pointer *)(uVar19 + 0x30);
        local_d0->logLevel = LVL_ERROR;
        local_d0->err = STX_ERR_PROGNAME;
        (local_d0->pos).line = (size_t)pPVar10;
        (local_d0->pos).startIndex = (size_t)pPVar11;
        (local_d0->pos).endIndex = (size_t)pPVar4;
        (local_d0->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_d0->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_d0->extraPos).
        super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pPVar22 = (Parser *)(local_58 + 8);
        goto LAB_001195e7;
      }
      this_00 = (vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
                 *)&local_98;
    }
    std::
    vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
    ::emplace_back<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
              (this_00,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_c8);
  }
LAB_00119616:
  if ((_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_c8._0_8_ !=
      (Expr *)0x0) {
    (*(*(_func_int ***)local_c8._0_8_)[1])();
  }
  bVar16 = false;
LAB_00119628:
  if (bVar16) {
LAB_0011964d:
    if (isprog) {
      bVar16 = Token::operator!=(this->lexer->currentToken,TOK_EOF);
      uVar17 = (undefined1)local_c8._8_8_;
      if (bVar16) {
        pTVar6 = this->lexer->currentToken;
        local_c8._0_8_ = operator_new(0x38);
        sVar3 = (pTVar6->pos).line;
        piVar12 = (istream *)(pTVar6->pos).startIndex;
        pcVar7 = (pointer)(pTVar6->pos).endIndex;
        *(undefined2 *)local_c8._0_8_ = 2;
        *(SyntaxErrorCode *)(local_c8._0_8_ + 4) = STX_ERR_EXPECTED_EOF;
        ((Position *)(local_c8._0_8_ + 8))->line = sVar3;
        *(istream **)(local_c8._0_8_ + 0x10) = piVar12;
        (((string *)(local_c8._0_8_ + 0x18))->_M_dataplus)._M_p = pcVar7;
        (((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)(local_c8._0_8_ + 0x20))
        ->super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_c8._0_8_ + 0x28))->_M_allocated_capacity = 0;
        *(pointer *)(local_c8._0_8_ + 0x30) = (pointer)0x0;
        generateError((Parser *)local_58,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)this);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_58);
        if ((_Head_base<0UL,_pfederc::Expr_*,_false>)local_c8._0_8_ !=
            (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
          std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                    ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_c8,
                     (Error<pfederc::SyntaxErrorCode> *)local_c8._0_8_);
        }
        uVar17 = true;
      }
    }
    else {
      uVar17 = (undefined1)local_c8._8_8_;
    }
    pMVar14 = local_a0;
    (local_a0->
    super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Tuple_impl<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .super__Tuple_impl<3UL,_bool>.super__Head_base<3UL,_bool,_false>._M_head_impl = (bool)uVar17;
    (local_a0->
    super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Tuple_impl<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Head_base<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
    ._M_head_impl.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_98.
         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_a0->
    super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Tuple_impl<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Head_base<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
    ._M_head_impl.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_98.
         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_a0->
    super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Tuple_impl<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Head_base<2UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
    ._M_head_impl.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_98.
         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_a0->
    super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Head_base<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
    ._M_head_impl.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_78.
         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_a0->
    super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Head_base<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
    ._M_head_impl.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_a0->
    super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).
    super__Tuple_impl<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    .
    super__Head_base<1UL,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_false>
    ._M_head_impl.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.
         super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_a0->
    super__Tuple_impl<0UL,_const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_bool>
    ).super__Head_base<0UL,_const_pfederc::Token_*,_false>._M_head_impl = (Token *)local_c8._24_8_;
    std::
    vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ::~vector(&local_98);
    std::
    vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ::~vector(&local_78);
    return pMVar14;
  }
  goto LAB_00119077;
}

Assistant:

ModBody Parser::parseModBody(bool isprog) noexcept {
  const Token *progName{nullptr};
  Exprs imports;
  Exprs defs;

  bool err = false;

  while(*lexer.getCurrentToken() != TokenType::TOK_EOL) {
    while (*lexer.getCurrentToken() == TokenType::TOK_EOL)
      lexer.next(); // eat eols
    if (*lexer.getCurrentToken() == TokenType::TOK_EOF)
      break;

    const Token *tok = lexer.getCurrentToken();

    // terminate module on termination token
    if (!isprog && std::any_of(
        _TERMINATE_MOD_TOKEN.begin(), _TERMINATE_MOD_TOKEN.end(),
        [&tok](TokenType type) { return *tok == type; }))
      break;

    std::unique_ptr<Expr> expr(parseExpression());
    if (((isprog && *lexer.getCurrentToken() != TokenType::TOK_EOF)
        || !isprog)
        && *lexer.getCurrentToken() != TokenType::TOK_EOL) {
      if (isprog)
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOF_EOL, lexer.getCurrentToken()->getPosition()));
      else
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
      err = true;

      skipToStmtEol();
    } else if (*lexer.getCurrentToken() == TokenType::TOK_EOL) {
      lexer.next(); // eat eol
    }

    if (expr) {
      const bool validexpr = (isprog ?
        std::any_of(_ALLOWED_EXPR_PROG.begin(), _ALLOWED_EXPR_PROG.end(),
          [&expr](ExprType type) { return expr->getType() == type; }) :
        std::any_of(_ALLOWED_EXPR_MOD.begin(), _ALLOWED_EXPR_MOD.end(),
          [&expr](ExprType type) { return expr->getType() == type; })) ||
      // valid global assignments
        isBiOpExpr(*expr, TokenType::TOK_OP_ASG_DCL) ||
        (isBiOpExpr(*expr, TokenType::TOK_OP_ASG) &&
        isBiOpExpr(dynamic_cast<BiOpExpr&>(*expr).getLeft(), TokenType::TOK_OP_DCL));

      if (!validexpr) {
        generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_EXPR, expr->getPosition()));
        err = true;
        continue;
      }

      switch (expr->getType()) {
      case ExprType::EXPR_PROGNAME:
        if (progName) {
          generateError(std::make_unique<SyntaxError>(LVL_ERROR,
            SyntaxErrorCode::STX_ERR_PROGNAME, expr->getPosition()));
          err = true;
        } else
          progName = dynamic_cast<ProgNameExpr&>(*expr).getTokenPtr();

        break;
      case ExprType::EXPR_USE:
        imports.push_back(std::move(expr));
        break;
      default:
        defs.push_back(std::move(expr));
        break;
      }
    }
  }

  if (isprog && *lexer.getCurrentToken() != TokenType::TOK_EOF) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOF, lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  return ModBody(progName, std::move(imports), std::move(defs), err);
}